

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O3

void __thiscall
GuillotineBinPack::Insert
          (GuillotineBinPack *this,TArray<RectSize,_RectSize> *rects,TArray<Rect,_Rect> *dst,
          bool merge,FreeRectChoiceHeuristic rectChoice,GuillotineSplitHeuristic splitMethod)

{
  uint *puVar1;
  int height;
  int iVar2;
  Rect *pRVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar10;
  Rect *pRVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint local_74;
  Rect local_58;
  DisjointRectCollection *local_40;
  TArray<Rect,_Rect> *local_38;
  uint uVar9;
  
  if (dst->Count != 0) {
    dst->Count = 0;
  }
  uVar10 = *(uint *)(rects + 0xc);
  if (uVar10 != 0) {
    local_38 = &this->usedRectangles;
    local_40 = &this->disjointRects;
    uVar12 = 0;
    local_74 = 0;
    bVar6 = false;
    do {
      uVar7 = (ulong)uVar10;
      uVar10 = (this->freeRectangles).Count;
      if (uVar10 == 0) {
        return;
      }
      iVar15 = 0x7fffffff;
      uVar8 = 0;
      do {
        uVar9 = uVar8;
        if ((int)uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          uVar14 = 0;
          do {
            iVar5 = *(int *)(*(long *)rects + uVar14 * 8);
            height = *(int *)(*(long *)rects + 4 + uVar14 * 8);
            pRVar11 = (this->freeRectangles).Array;
            iVar2 = pRVar11[uVar8].width;
            pRVar11 = pRVar11 + uVar8;
            uVar13 = (uint)uVar14;
            if ((iVar5 == iVar2) && (height == pRVar11->height)) {
              uVar10 = (this->freeRectangles).Count;
              bVar6 = false;
LAB_003007e8:
              iVar15 = -0x80000000;
              uVar9 = uVar10;
              local_74 = uVar13;
              uVar12 = uVar8;
              goto LAB_003007f6;
            }
            if ((height == iVar2) && (iVar5 == pRVar11->height)) {
              uVar10 = (this->freeRectangles).Count;
              bVar6 = true;
              goto LAB_003007e8;
            }
            if ((iVar2 < iVar5) || (pRVar11->height < height)) {
              if ((height <= iVar2) &&
                 ((iVar5 <= pRVar11->height &&
                  (iVar5 = ScoreByHeuristic(height,iVar5,pRVar11,rectChoice), iVar5 < iVar15)))) {
                bVar6 = true;
                iVar15 = iVar5;
                local_74 = uVar13;
                uVar12 = uVar8;
              }
            }
            else {
              iVar5 = ScoreByHeuristic(iVar5,height,pRVar11,rectChoice);
              if (iVar5 < iVar15) {
                bVar6 = false;
                iVar15 = iVar5;
                local_74 = uVar13;
                uVar12 = uVar8;
              }
            }
            uVar14 = uVar14 + 1;
            uVar7 = (ulong)*(uint *)(rects + 0xc);
          } while (uVar14 < uVar7);
          uVar10 = (this->freeRectangles).Count;
        }
LAB_003007f6:
        uVar8 = uVar9 + 1;
      } while (uVar8 < uVar10);
      if (iVar15 == 0x7fffffff) {
        return;
      }
      pRVar3 = (this->freeRectangles).Array;
      pRVar11 = pRVar3 + (int)uVar12;
      local_58.x = pRVar11->x;
      local_58.y = pRVar11->y;
      local_58._8_8_ = *(undefined8 *)(*(long *)rects + (long)(int)local_74 * 8);
      if (bVar6) {
        iVar15 = local_58.height;
        local_58.height = local_58.width;
        local_58.width = iVar15;
      }
      SplitFreeRectByHeuristic(this,pRVar3 + (int)uVar12,&local_58,splitMethod);
      uVar10 = (this->freeRectangles).Count;
      if (uVar12 < uVar10) {
        uVar10 = uVar10 - 1;
        (this->freeRectangles).Count = uVar10;
        if (uVar12 <= uVar10 && uVar10 - uVar12 != 0) {
          pRVar11 = (this->freeRectangles).Array;
          memmove(pRVar11 + uVar12,pRVar11 + (ulong)uVar12 + 1,(ulong)(uVar10 - uVar12) << 4);
        }
      }
      if (local_74 < *(uint *)(rects + 0xc)) {
        uVar10 = *(uint *)(rects + 0xc) - 1;
        *(uint *)(rects + 0xc) = uVar10;
        if (local_74 <= uVar10 && uVar10 - local_74 != 0) {
          memmove((void *)(*(long *)rects + (ulong)local_74 * 8),
                  (void *)(*(long *)rects + (ulong)local_74 * 8 + 8),(ulong)(uVar10 - local_74) << 3
                 );
        }
      }
      if (merge) {
        MergeFreeList(this);
      }
      TArray<Rect,_Rect>::Grow(local_38,1);
      pRVar11 = (this->usedRectangles).Array + (this->usedRectangles).Count;
      pRVar11->x = local_58.x;
      pRVar11->y = local_58.y;
      pRVar11->width = local_58.width;
      pRVar11->height = local_58.height;
      puVar1 = &(this->usedRectangles).Count;
      *puVar1 = *puVar1 + 1;
      bVar4 = DisjointRectCollection::Add(local_40,&local_58);
      if (!bVar4) {
        __assert_fail("disjointRects.Add(newNode) == true",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                      ,0x94,
                      "void GuillotineBinPack::Insert(TArray<RectSize> &, TArray<Rect> &, bool, FreeRectChoiceHeuristic, GuillotineSplitHeuristic)"
                     );
      }
      uVar10 = *(uint *)(rects + 0xc);
    } while (uVar10 != 0);
  }
  return;
}

Assistant:

void GuillotineBinPack::Insert(TArray<RectSize> &rects, TArray<Rect> &dst, bool merge, 
	FreeRectChoiceHeuristic rectChoice, GuillotineSplitHeuristic splitMethod)
{
	dst.Clear();

	// Remember variables about the best packing choice we have made so far during the iteration process.
	int bestFreeRect = 0;
	int bestRect = 0;
	bool bestFlipped = false;

	// Pack rectangles one at a time until we have cleared the rects array of all rectangles.
	// rects will get destroyed in the process.
	while(rects.Size() > 0)
	{
		// Stores the penalty score of the best rectangle placement - bigger=worse, smaller=better.
		int bestScore = INT_MAX;

		for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		{
			for(unsigned j = 0; j < rects.Size(); ++j)
			{
				// If this rectangle is a perfect match, we pick it instantly.
				if (rects[j].width == freeRectangles[i].width && rects[j].height == freeRectangles[i].height)
				{
					bestFreeRect = i;
					bestRect = j;
					bestFlipped = false;
					bestScore = INT_MIN;
					i = freeRectangles.Size(); // Force a jump out of the outer loop as well - we got an instant fit.
					break;
				}
				// If flipping this rectangle is a perfect match, pick that then.
				else if (rects[j].height == freeRectangles[i].width && rects[j].width == freeRectangles[i].height)
				{
					bestFreeRect = i;
					bestRect = j;
					bestFlipped = true;
					bestScore = INT_MIN;
					i = freeRectangles.Size(); // Force a jump out of the outer loop as well - we got an instant fit.
					break;
				}
				// Try if we can fit the rectangle upright.
				else if (rects[j].width <= freeRectangles[i].width && rects[j].height <= freeRectangles[i].height)
				{
					int score = ScoreByHeuristic(rects[j].width, rects[j].height, freeRectangles[i], rectChoice);
					if (score < bestScore)
					{
						bestFreeRect = i;
						bestRect = j;
						bestFlipped = false;
						bestScore = score;
					}
				}
				// If not, then perhaps flipping sideways will make it fit?
				else if (rects[j].height <= freeRectangles[i].width && rects[j].width <= freeRectangles[i].height)
				{
					int score = ScoreByHeuristic(rects[j].height, rects[j].width, freeRectangles[i], rectChoice);
					if (score < bestScore)
					{
						bestFreeRect = i;
						bestRect = j;
						bestFlipped = true;
						bestScore = score;
					}
				}
			}
		}

		// If we didn't manage to find any rectangle to pack, abort.
		if (bestScore == INT_MAX)
			return;

		// Otherwise, we're good to go and do the actual packing.
		Rect newNode;
		newNode.x = freeRectangles[bestFreeRect].x;
		newNode.y = freeRectangles[bestFreeRect].y;
		newNode.width = rects[bestRect].width;
		newNode.height = rects[bestRect].height;

		if (bestFlipped)
			std::swap(newNode.width, newNode.height);

		// Remove the free space we lost in the bin.
		SplitFreeRectByHeuristic(freeRectangles[bestFreeRect], newNode, splitMethod);
		freeRectangles.Delete(bestFreeRect);

		// Remove the rectangle we just packed from the input list.
		rects.Delete(bestRect);

		// Perform a Rectangle Merge step if desired.
		if (merge)
			MergeFreeList();

		// Remember the new used rectangle.
		usedRectangles.Push(newNode);

		// Check that we're really producing correct packings here.
#ifdef _DEBUG
		assert(disjointRects.Add(newNode) == true);
#endif
	}
}